

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void Memory::Recycler::TrackNativeAllocatedMemoryBlock
               (Recycler *recycler,void *memBlock,size_t sizeCat)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (sizeCat == 0 || (sizeCat & 0xf) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x5d4,"(HeapInfo::IsAlignedSize(sizeCat))",
                       "HeapInfo::IsAlignedSize(sizeCat)");
    if (!bVar2) goto LAB_0067d215;
    *puVar3 = 0;
  }
  if (0x300 < sizeCat) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x5d5,"(HeapInfo::IsSmallObject(sizeCat))",
                       "HeapInfo::IsSmallObject(sizeCat)");
    if (!bVar2) goto LAB_0067d215;
    *puVar3 = 0;
  }
  bVar2 = DoProfileAllocTracker();
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x5d8,"(!Recycler::DoProfileAllocTracker())",
                       "Why did we register allocation tracking callback if all allocations are forced to slow path?"
                      );
    if (!bVar2) goto LAB_0067d215;
    *puVar3 = 0;
  }
  RecyclerMemoryTracking::ReportAllocation(recycler,memBlock,sizeCat);
  if (recycler->verifyEnabled != false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x5e1,"(!recycler->VerifyEnabled())",
                       "Why did we register allocation tracking callback if all allocations are forced to slow path?"
                      );
    if (!bVar2) {
LAB_0067d215:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void Recycler::TrackNativeAllocatedMemoryBlock(Recycler * recycler, void * memBlock, size_t sizeCat)
{
    Assert(HeapInfo::IsAlignedSize(sizeCat));
    Assert(HeapInfo::IsSmallObject(sizeCat));

#ifdef PROFILE_RECYCLER_ALLOC
    AssertMsg(!Recycler::DoProfileAllocTracker(), "Why did we register allocation tracking callback if all allocations are forced to slow path?");
#endif

    RecyclerMemoryTracking::ReportAllocation(recycler, memBlock, sizeCat);
    RECYCLER_PERF_COUNTER_INC(LiveObject);
    RECYCLER_PERF_COUNTER_ADD(LiveObjectSize, sizeCat);
    RECYCLER_PERF_COUNTER_SUB(FreeObjectSize, sizeCat);

#ifdef RECYCLER_MEMORY_VERIFY
    AssertMsg(!recycler->VerifyEnabled(), "Why did we register allocation tracking callback if all allocations are forced to slow path?");
#endif
}